

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2BInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int32_t iVar6;
  uint32_t in_ESI;
  MCInst *in_RDI;
  int imm32;
  uint tmp;
  uint imm11;
  uint imm10;
  uint I2;
  uint I1;
  uint J2;
  uint J1;
  uint S;
  DecodeStatus Status;
  
  uVar1 = fieldFromInstruction_4(in_ESI,0x1a,1);
  uVar2 = fieldFromInstruction_4(in_ESI,0xd,1);
  uVar3 = fieldFromInstruction_4(in_ESI,0xb,1);
  uVar4 = fieldFromInstruction_4(in_ESI,0x10,10);
  uVar5 = fieldFromInstruction_4(in_ESI,0,0xb);
  iVar6 = SignExtend32((uVar1 << 0x17 | (uint)((uVar2 != uVar1 ^ 0xffU) & 1) << 0x16 |
                        (uint)((uVar3 != uVar1 ^ 0xffU) & 1) << 0x15 | uVar4 << 0xb | uVar5) << 1,
                       0x19);
  MCOperand_CreateImm0(in_RDI,(long)iVar6);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeT2BInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus Status = MCDisassembler_Success;

	// Note the J1 and J2 values are from the encoded instruction.  So here
	// change them to I1 and I2 values via as documented:
	// I1 = NOT(J1 EOR S);
	// I2 = NOT(J2 EOR S);
	// and build the imm32 with one trailing zero as documented:
	// imm32 = SignExtend(S:I1:I2:imm10:imm11:'0', 32);
	unsigned S = fieldFromInstruction_4(Insn, 26, 1);
	unsigned J1 = fieldFromInstruction_4(Insn, 13, 1);
	unsigned J2 = fieldFromInstruction_4(Insn, 11, 1);
	unsigned I1 = !(J1 ^ S);
	unsigned I2 = !(J2 ^ S);
	unsigned imm10 = fieldFromInstruction_4(Insn, 16, 10);
	unsigned imm11 = fieldFromInstruction_4(Insn, 0, 11);
	unsigned tmp = (S << 23) | (I1 << 22) | (I2 << 21) | (imm10 << 11) | imm11;
	int imm32 = SignExtend32(tmp << 1, 25);
	MCOperand_CreateImm0(Inst, imm32);

	return Status;
}